

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O1

void cm_zlib__tr_align(deflate_state *s)

{
  Bytef BVar1;
  ulg uVar2;
  int iVar3;
  ushort uVar4;
  
  iVar3 = s->bi_valid;
  uVar4 = (ushort)(2 << ((byte)iVar3 & 0x1f)) | s->bi_buf;
  s->bi_buf = uVar4;
  if (iVar3 < 0xe) {
    iVar3 = iVar3 + 3;
  }
  else {
    uVar2 = s->pending;
    s->pending = uVar2 + 1;
    s->pending_buf[uVar2] = (Bytef)uVar4;
    BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
    uVar2 = s->pending;
    s->pending = uVar2 + 1;
    s->pending_buf[uVar2] = BVar1;
    s->bi_buf = (ush)(2 >> (0x10U - (char)s->bi_valid & 0x1f));
    iVar3 = s->bi_valid + -0xd;
  }
  s->bi_valid = iVar3;
  if (iVar3 < 10) {
    iVar3 = iVar3 + 7;
  }
  else {
    uVar2 = s->pending;
    s->pending = uVar2 + 1;
    s->pending_buf[uVar2] = (Bytef)s->bi_buf;
    BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
    uVar2 = s->pending;
    s->pending = uVar2 + 1;
    s->pending_buf[uVar2] = BVar1;
    s->bi_buf = 0;
    iVar3 = s->bi_valid + -9;
  }
  s->bi_valid = iVar3;
  bi_flush(s);
  return;
}

Assistant:

void ZLIB_INTERNAL _tr_align(deflate_state *s) {
    send_bits(s, STATIC_TREES<<1, 3);
    send_code(s, END_BLOCK, static_ltree);
#ifdef ZLIB_DEBUG
    s->compressed_len += 10L; /* 3 for block type, 7 for EOB */
#endif
    bi_flush(s);
}